

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_options.hpp
# Opt level: O3

void __thiscall
jsoncons::csv::basic_csv_decode_options<char>::basic_csv_decode_options
          (basic_csv_decode_options<char> *this)

{
  basic_csv_options_common<char>::basic_csv_options_common
            ((basic_csv_options_common<char> *)&this->field_0x60);
  this->_vptr_basic_csv_decode_options = (_func_int **)0xb34a48;
  *(undefined8 *)&this->field_0x60 = 0xb34a70;
  *(ushort *)&this->field_0x8 = (ushort)*(undefined4 *)&this->field_0x8 & 0xfc00 | 0x104;
  this->comment_starter_ = '\0';
  this->mapping_kind_ = 0;
  this->header_lines_ = 0;
  this->max_lines_ = 0xffffffffffffffff;
  (this->column_types_)._M_dataplus._M_p = (pointer)&(this->column_types_).field_2;
  (this->column_types_)._M_string_length = 0;
  (this->column_types_).field_2._M_local_buf[0] = '\0';
  (this->column_defaults_)._M_dataplus._M_p = (pointer)&(this->column_defaults_).field_2;
  (this->column_defaults_)._M_string_length = 0;
  (this->column_defaults_).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

basic_csv_decode_options()
        : assume_header_(false),
          ignore_empty_values_(false),
          ignore_empty_lines_(true),
          trim_leading_(false),
          trim_trailing_(false),
          trim_leading_inside_quotes_(false),
          trim_trailing_inside_quotes_(false),
          unquoted_empty_value_is_null_(false),
          infer_types_(true),
          lossless_number_(false)
    {}